

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2::isNormalizedUTF8(Normalizer2 *this,StringPiece s,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  StringPiece utf8;
  bool local_9d;
  UnicodeString local_70;
  UErrorCode *local_30;
  UErrorCode *errorCode_local;
  Normalizer2 *this_local;
  StringPiece s_local;
  
  this_local = (Normalizer2 *)s.ptr_;
  s_local.ptr_._0_4_ = s.length_;
  local_30 = errorCode;
  errorCode_local = (UErrorCode *)this;
  UVar1 = ::U_SUCCESS(*errorCode);
  utf8._9_7_ = (undefined7)((ulong)errorCode >> 8);
  utf8.length_._0_1_ = UVar1;
  local_9d = false;
  if (UVar1 != '\0') {
    utf8.ptr_ = (char *)(ulong)(uint)s_local.ptr_;
    UnicodeString::fromUTF8(&local_70,(UnicodeString *)this_local,utf8);
    iVar2 = (*(this->super_UObject)._vptr_UObject[0xb])(this,&local_70,local_30);
    local_9d = (char)iVar2 != '\0';
  }
  s_local._15_1_ = local_9d;
  if (UVar1 != '\0') {
    UnicodeString::~UnicodeString(&local_70);
  }
  return s_local._15_1_;
}

Assistant:

UBool
Normalizer2::isNormalizedUTF8(StringPiece s, UErrorCode &errorCode) const {
    return U_SUCCESS(errorCode) && isNormalized(UnicodeString::fromUTF8(s), errorCode);
}